

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapms.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  int cnum;
  int c;
  int in_stack_00000114;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    local_18 = 0;
    while (local_14 = getopt(local_8,local_10,"c:"), local_14 != -1) {
      if (local_14 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_18);
      }
    }
    if (local_18 < nva_cardsnum) {
      timing_pms_waits(in_stack_00000114);
      local_4 = 0;
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	timing_pms_waits(cnum);

	return 0;
}